

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

Vec_Int_t * Gia_ManSimReadFile(char *pFileIn)

{
  int iVar1;
  FILE *__stream;
  FILE *pFile;
  Vec_Int_t *vPat;
  int c;
  char *pFileIn_local;
  
  __stream = fopen(pFileIn,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file.\n");
    pFileIn_local = (char *)0x0;
  }
  else {
    pFileIn_local = (char *)Vec_IntAlloc(1000);
    while (iVar1 = fgetc(__stream), iVar1 != -1) {
      if ((iVar1 == 0x30) || (iVar1 == 0x31)) {
        Vec_IntPush((Vec_Int_t *)pFileIn_local,iVar1 + -0x30);
      }
    }
    fclose(__stream);
  }
  return (Vec_Int_t *)pFileIn_local;
}

Assistant:

Vec_Int_t * Gia_ManSimReadFile( char * pFileIn )
{
    int c;
    Vec_Int_t * vPat;
    FILE * pFile = fopen( pFileIn, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file.\n" );
        return NULL;
    }
    vPat = Vec_IntAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
        if ( c == '0' || c == '1' )
            Vec_IntPush( vPat, c - '0' );
    fclose( pFile );
    return vPat;
}